

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

CharFormat testing::internal::PrintAsCharLiteralTo<wchar_t,wchar_t>(wchar_t c,ostream *os)

{
  int in_EDX;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  switch((String *)(ulong)(uint)c) {
  case (String *)0x0:
    pcVar1 = "\\0";
    break;
  case (String *)0x1:
  case (String *)0x2:
  case (String *)0x3:
  case (String *)0x4:
  case (String *)0x5:
  case (String *)0x6:
switchD_0011ce0d_caseD_1:
    if (0x5e < (uint)(c + L'\xffffffe0')) {
      String::FormatHexInt_abi_cxx11_(&local_30,(String *)(ulong)(uint)c,in_EDX);
      std::operator+(&local_50,"\\x",&local_30);
      std::operator<<(os,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_30);
      return kHexEscape;
    }
    std::operator<<(os,(char)c);
    return kAsIs;
  case (String *)0x7:
    pcVar1 = "\\a";
    break;
  case (String *)0x8:
    pcVar1 = "\\b";
    break;
  case (String *)0x9:
    pcVar1 = "\\t";
    break;
  case (String *)0xa:
    pcVar1 = "\\n";
    break;
  case (String *)0xb:
    pcVar1 = "\\v";
    break;
  case (String *)0xc:
    pcVar1 = "\\f";
    break;
  case (String *)0xd:
    pcVar1 = "\\r";
    break;
  default:
    if (c == L'\'') {
      pcVar1 = "\\\'";
    }
    else {
      if (c != L'\\') goto switchD_0011ce0d_caseD_1;
      pcVar1 = "\\\\";
    }
  }
  std::operator<<(os,pcVar1);
  return kSpecialEscape;
}

Assistant:

static CharFormat PrintAsCharLiteralTo(Char c, ostream* os) {
  switch (static_cast<wchar_t>(c)) {
    case L'\0':
      *os << "\\0";
      break;
    case L'\'':
      *os << "\\'";
      break;
    case L'\\':
      *os << "\\\\";
      break;
    case L'\a':
      *os << "\\a";
      break;
    case L'\b':
      *os << "\\b";
      break;
    case L'\f':
      *os << "\\f";
      break;
    case L'\n':
      *os << "\\n";
      break;
    case L'\r':
      *os << "\\r";
      break;
    case L'\t':
      *os << "\\t";
      break;
    case L'\v':
      *os << "\\v";
      break;
    default:
      if (IsPrintableAscii(c)) {
        *os << static_cast<char>(c);
        return kAsIs;
      } else {
        *os << "\\x" + String::FormatHexInt(static_cast<UnsignedChar>(c));
        return kHexEscape;
      }
  }
  return kSpecialEscape;
}